

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QWidget * __thiscall
QWidgetPrivate::childAt_helper(QWidgetPrivate *this,QPointF *p,bool ignoreChildrenInDestructor)

{
  long lVar1;
  long lVar2;
  QWExtra *pQVar3;
  char cVar4;
  QWidget *pQVar5;
  long in_FS_OFFSET;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  QPointF local_48;
  double local_38;
  double dStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)&this->field_0x28 != 0) {
    lVar1 = *(long *)&this->field_0x8;
    lVar2 = *(long *)(lVar1 + 0x20);
    auVar11._0_4_ = (*(uint *)(lVar2 + 0x14) ^ 0xffffffff) + (int)*(undefined8 *)(lVar2 + 0x1c);
    auVar11._4_4_ =
         (*(uint *)(lVar2 + 0x18) ^ 0xffffffff) +
         (int)((ulong)*(undefined8 *)(lVar2 + 0x1c) >> 0x20);
    auVar11._8_4_ = 0xffffffff;
    auVar11._12_4_ = 0xffffffff;
    auVar7._0_4_ = -(uint)(-1 < auVar11._0_4_);
    auVar7._4_4_ = -(uint)(-1 < auVar11._4_4_);
    auVar7._8_8_ = 0;
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar8 = auVar7 ^ auVar8 | auVar11 & auVar7;
    local_48.xp = 0.0;
    local_48.yp = 0.0;
    auVar9._0_8_ = auVar8._0_8_;
    auVar9._8_4_ = auVar8._4_4_;
    auVar9._12_4_ = -(uint)(auVar8._4_4_ < 0);
    uVar6 = CONCAT44(-(uint)(auVar8._0_4_ < 0),auVar8._0_4_) + 1;
    uVar10 = auVar9._8_8_ + 1;
    local_38 = ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(uVar6 & 0xffffffff | 0x4330000000000000);
    dStack_30 = ((double)(uVar10 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(uVar10 & 0xffffffff | 0x4330000000000000);
    cVar4 = QRectF::contains(&local_48);
    if (cVar4 != '\0') {
      pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t
               .super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if (((pQVar3 != (QWExtra *)0x0) && ((pQVar3->field_0x7c & 0x80) != 0)) &&
         (lVar1 = *(long *)(lVar1 + 8), (*(byte *)(lVar1 + 0x244) & 0x80) == 0)) {
        auVar12._0_8_ = (double)((ulong)p->xp & 0x8000000000000000 | 0x3fe0000000000000) + p->xp;
        auVar12._8_8_ = (double)((ulong)p->yp & 0x8000000000000000 | 0x3fe0000000000000) + p->yp;
        auVar8 = minpd(_DAT_0066f5d0,auVar12);
        auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
        auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
        movmskpd((int)lVar1,auVar13);
        cVar4 = QRegion::contains((QPoint *)&pQVar3->mask);
        if (cVar4 == '\0') goto LAB_0030d538;
      }
      pQVar5 = childAtRecursiveHelper(this,p,ignoreChildrenInDestructor);
      goto LAB_0030d53a;
    }
  }
LAB_0030d538:
  pQVar5 = (QWidget *)0x0;
LAB_0030d53a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QWidgetPrivate::childAt_helper(const QPointF &p, bool ignoreChildrenInDestructor) const
{
    if (children.isEmpty())
        return nullptr;

    if (!pointInsideRectAndMask(p))
        return nullptr;
    return childAtRecursiveHelper(p, ignoreChildrenInDestructor);
}